

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O1

image_char new_image_char(uint xsize,uint ysize)

{
  int *piVar1;
  image_char piVar2;
  uchar *puVar3;
  image_char extraout_RAX;
  image_int piVar4;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint xsize_00;
  undefined4 in_register_0000003c;
  uchar *puVar8;
  uint uVar9;
  
  puVar8 = (uchar *)CONCAT44(in_register_0000003c,xsize);
  uVar9 = ysize;
  if ((xsize == 0) || (ysize == 0)) {
    new_image_char();
LAB_00104230:
    new_image_char();
  }
  else {
    puVar8 = (uchar *)0x10;
    piVar2 = (image_char)malloc(0x10);
    if (piVar2 == (image_char)0x0) goto LAB_00104230;
    puVar8 = (uchar *)(ulong)(ysize * xsize);
    uVar9 = 1;
    puVar3 = (uchar *)calloc((size_t)puVar8,1);
    piVar2->data = puVar3;
    if (puVar3 != (uchar *)0x0) {
      piVar2->xsize = xsize;
      piVar2->ysize = ysize;
      return piVar2;
    }
  }
  new_image_char();
  uVar7 = (uint)puVar8;
  uVar5 = uVar9;
  piVar2 = new_image_char(uVar7,uVar9);
  if ((piVar2 != (image_char)0x0) && (puVar8 = piVar2->data, puVar8 != (uchar *)0x0)) {
    uVar9 = uVar9 * uVar7;
    if (uVar9 != 0) {
      memset(puVar8,extraout_EDX & 0xff,(ulong)uVar9);
    }
    return piVar2;
  }
  new_image_char_ini();
  puVar3 = puVar8;
  if ((puVar8 != (uchar *)0x0) && (puVar3 = *(uchar **)puVar8, puVar3 != (uchar *)0x0)) {
    free(puVar3);
    free(puVar8);
    return extraout_RAX;
  }
  uVar7 = (uint)puVar3;
  free_image_int();
  uVar9 = uVar5;
  if ((uVar7 == 0) || (uVar5 == 0)) {
    xsize_00 = uVar7;
    new_image_int();
  }
  else {
    xsize_00 = 0x10;
    piVar2 = (image_char)malloc(0x10);
    if (piVar2 != (image_char)0x0) {
      xsize_00 = uVar5 * uVar7;
      uVar9 = 4;
      puVar8 = (uchar *)calloc((ulong)xsize_00,4);
      piVar2->data = puVar8;
      if (puVar8 != (uchar *)0x0) {
        piVar2->xsize = uVar7;
        piVar2->ysize = uVar5;
        return piVar2;
      }
      goto LAB_001042fd;
    }
  }
  new_image_int();
LAB_001042fd:
  new_image_int();
  piVar4 = new_image_int(xsize_00,uVar9);
  if (uVar9 * xsize_00 != 0) {
    piVar1 = piVar4->data;
    uVar6 = 0;
    do {
      piVar1[uVar6] = extraout_EDX_00;
      uVar6 = uVar6 + 1;
    } while (uVar9 * xsize_00 != uVar6);
  }
  return (image_char)piVar4;
}

Assistant:

image_char new_image_char(unsigned int xsize, unsigned int ysize)
{
    image_char image;

    /* check parameters */
    if ( xsize == 0 || ysize == 0 ) error("new_image_char: invalid image size.");

    /* get memory */
    image = (image_char) malloc( sizeof(struct image_char_s) );
    if ( image == NULL ) error("not enough memory.");
    image->data = (unsigned char *) calloc( (size_t) (xsize * ysize),
                                            sizeof(unsigned char) );
    if ( image->data == NULL ) error("not enough memory.");

    /* set image size */
    image->xsize = xsize;
    image->ysize = ysize;

    return image;
}